

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj_loader_halfedge.h
# Opt level: O3

GLfloat * __thiscall CMU462::ObjLoaderHalfedgeMesh::getData(ObjLoaderHalfedgeMesh *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  _List_node_base *p_Var4;
  long lVar5;
  long lVar6;
  long lVar7;
  float fVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  GLfloat *pGVar12;
  ulong uVar13;
  long lVar14;
  HalfedgeMesh *pHVar15;
  _List_node_base *p_Var16;
  undefined8 uVar17;
  undefined1 auVar18 [16];
  
  pHVar15 = this->mesh;
  iVar9 = (int)(pHVar15->faces).super__List_base<CMU462::Face,_std::allocator<CMU462::Face>_>.
               _M_impl._M_node._M_size;
  this->nf = iVar9;
  if (this->isData == true) {
    if (this->vertices != (GLfloat *)0x0) {
      operator_delete__(this->vertices);
      iVar9 = this->nf;
      pHVar15 = this->mesh;
    }
  }
  else {
    this->isData = true;
  }
  uVar13 = 0xffffffffffffffff;
  if (-1 < iVar9) {
    uVar13 = (long)(iVar9 * 0x12) << 2;
  }
  pGVar12 = (GLfloat *)operator_new__(uVar13);
  this->vertices = pGVar12;
  p_Var16 = (pHVar15->faces).super__List_base<CMU462::Face,_std::allocator<CMU462::Face>_>._M_impl.
            _M_node.super__List_node_base._M_next;
  if (p_Var16 != (_List_node_base *)&pHVar15->faces) {
    lVar14 = 0x38;
    do {
      p_Var4 = *(_List_node_base **)((long)(p_Var16[9]._M_next + 1) + 8);
      lVar5 = (long)p_Var16[9]._M_next[2]._M_next;
      lVar6 = (long)p_Var4[2]._M_next;
      dVar1 = *(double *)(lVar5 + 0x20);
      lVar7 = (long)(*(_List_node_base **)((long)(p_Var4 + 1) + 8))[2]._M_next;
      dVar2 = *(double *)(lVar6 + 0x20);
      dVar3 = *(double *)(lVar7 + 0x20);
      *(ulong *)((long)pGVar12 + lVar14 + -0x38) =
           CONCAT44((float)*(double *)(lVar5 + 0x18),(float)*(double *)(lVar5 + 0x10));
      *(float *)((long)pGVar12 + lVar14 + -0x30) = (float)dVar1;
      *(ulong *)((long)pGVar12 + lVar14 + -0x20) =
           CONCAT44((float)*(double *)(lVar6 + 0x18),(float)*(double *)(lVar6 + 0x10));
      *(float *)((long)pGVar12 + lVar14 + -0x18) = (float)dVar2;
      *(ulong *)((long)pGVar12 + lVar14 + -8) =
           CONCAT44((float)*(double *)(lVar7 + 0x18),(float)*(double *)(lVar7 + 0x10));
      *(float *)((long)pGVar12 + lVar14) = (float)dVar3;
      iVar9 = rand();
      iVar10 = rand();
      iVar11 = rand();
      fVar8 = (float)iVar11 / 2.1474836e+09;
      auVar18._0_8_ = (double)iVar9;
      auVar18._8_8_ = (double)iVar10;
      auVar18 = divpd(auVar18,_DAT_00127090);
      uVar17 = CONCAT44((float)auVar18._8_8_,(float)auVar18._0_8_);
      pGVar12 = this->vertices;
      *(undefined8 *)((long)pGVar12 + lVar14 + -0x2c) = uVar17;
      *(float *)((long)pGVar12 + lVar14 + -0x24) = fVar8;
      *(undefined8 *)((long)pGVar12 + lVar14 + -0x14) = uVar17;
      *(float *)((long)pGVar12 + lVar14 + -0xc) = fVar8;
      *(undefined8 *)((long)pGVar12 + lVar14 + 4) = uVar17;
      *(float *)((long)pGVar12 + lVar14 + 0xc) = fVar8;
      p_Var16 = p_Var16->_M_next;
      lVar14 = lVar14 + 0x48;
    } while (p_Var16 != (_List_node_base *)&this->mesh->faces);
  }
  return pGVar12;
}

Assistant:

GLfloat* getData() {
        // Generate new vertices.
        nf = mesh->nFaces();
        if (isData) {
            delete[] vertices;
        } else {
            isData = true;
        }
        vertices = new GLfloat[STRIDE * nf];

        size_t i = 0;
        for (auto f = mesh->facesBegin(); f != mesh->facesEnd(); f++, i++) {
            auto pos1 = f->halfedge()->vertex()->position;
            auto pos2 = f->halfedge()->next()->vertex()->position;
            auto pos3 = f->halfedge()->next()->next()->vertex()->position;

            vertices[STRIDE * i    ]  = pos1.x;
            vertices[STRIDE * i + 1]  = pos1.y;
            vertices[STRIDE * i + 2]  = pos1.z;

            vertices[STRIDE * i + NUM_ATTR    ]  = pos2.x;
            vertices[STRIDE * i + NUM_ATTR + 1]  = pos2.y;
            vertices[STRIDE * i + NUM_ATTR + 2]  = pos2.z;

            vertices[STRIDE * i + NUM_ATTR * 2    ] = pos3.x;
            vertices[STRIDE * i + NUM_ATTR * 2 + 1] = pos3.y;
            vertices[STRIDE * i + NUM_ATTR * 2 + 2] = pos3.z;

            GLfloat color1 = static_cast<double>(rand()) / RAND_MAX;
            GLfloat color2 = static_cast<double>(rand()) / RAND_MAX;
            GLfloat color3 = static_cast<double>(rand()) / RAND_MAX;
            for (size_t j = 0; j < 3; ++j) {
                vertices[STRIDE * i + NUM_ATTR * j + 3] = color1;
                vertices[STRIDE * i + NUM_ATTR * j + 4] = color2;
                vertices[STRIDE * i + NUM_ATTR * j + 5] = color3;
            }
        }

        return vertices;
    }